

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

SoapySDRRange * SoapySDRDevice_getMasterClockRates(SoapySDRDevice *device,size_t *length)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  SoapySDRRange *pSVar6;
  long lVar7;
  long lVar8;
  size_t __nmemb;
  void *local_40;
  void *local_38;
  
  *length = 0;
  puVar5 = (undefined1 *)__tls_get_addr(&PTR_0013df28);
  *puVar5 = 0;
  *(undefined4 *)(puVar5 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x230))(&local_40,device);
  __nmemb = ((long)local_38 - (long)local_40 >> 3) * -0x5555555555555555;
  pSVar6 = (SoapySDRRange *)calloc(__nmemb,0x18);
  if (local_38 == local_40) {
    *length = __nmemb;
    if (local_40 == (void *)0x0) {
      return pSVar6;
    }
  }
  else {
    lVar7 = __nmemb + (__nmemb == 0);
    lVar8 = 0x10;
    do {
      uVar3 = *(undefined8 *)((long)local_40 + lVar8);
      puVar1 = (undefined8 *)((long)local_40 + lVar8 + -0x10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pSVar6 + lVar8 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)&pSVar6->minimum + lVar8) = uVar3;
      lVar8 = lVar8 + 0x18;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    *length = __nmemb;
  }
  operator_delete(local_40);
  return pSVar6;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getMasterClockRates(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getMasterClockRates(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}